

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O2

void cleanup_names(void)

{
  char *str;
  long lVar1;
  long lVar2;
  
  for (lVar1 = 0; lVar1 != 3; lVar1 = lVar1 + 1) {
    lVar2 = 0;
    while( true ) {
      str = *(char **)((long)name_sections[lVar1] + lVar2);
      if (str == (char *)0x0) break;
      string_free(str);
      lVar2 = lVar2 + 8;
    }
    mem_free(name_sections[lVar1]);
  }
  mem_free(name_sections);
  return;
}

Assistant:

static void cleanup_names(void)
{
	int i, j;
	for (i = 0; i < RANDNAME_NUM_TYPES; i++) {
		for (j = 0; name_sections[i][j]; j++) {
			string_free((char *)name_sections[i][j]);
		}
		mem_free(name_sections[i]);
	}
	mem_free(name_sections);
}